

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_NoiseAlert(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor *target;
  
  target = it;
  if (arg0 != 0) {
    for (target = AActor::TIDHash[arg0 & 0x7f]; target != (AActor *)0x0; target = target->inext) {
      if (target->tid == arg0) goto LAB_004069de;
    }
    target = (AActor *)0x0;
  }
LAB_004069de:
  if ((arg1 != 0) && (it = target, arg1 != arg0)) {
    for (it = AActor::TIDHash[arg1 & 0x7f]; it != (AActor *)0x0; it = it->inext) {
      if (it->tid == arg1) goto LAB_00406a15;
    }
    it = (AActor *)0x0;
  }
LAB_00406a15:
  P_NoiseAlert(target,it,false,0.0);
  return 1;
}

Assistant:

FUNC(LS_NoiseAlert)
// NoiseAlert (TID of target, TID of emitter)
{
	AActor *target, *emitter;

	if (arg0 == 0)
	{
		target = it;
	}
	else
	{
		FActorIterator iter (arg0);
		target = iter.Next();
	}

	if (arg1 == 0)
	{
		emitter = it;
	}
	else if (arg1 == arg0)
	{
		emitter = target;
	}
	else
	{
		FActorIterator iter (arg1);
		emitter = iter.Next();
	}

	P_NoiseAlert (target, emitter);
	return true;
}